

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbitset_unit.c
# Opt level: O2

void test_counts(void)

{
  bitset_t *b1;
  bitset_t *b2;
  size_t sVar1;
  size_t i;
  
  b1 = bitset_create();
  i = 0;
  b2 = bitset_create();
  for (sVar1 = 0; sVar1 != 3000; sVar1 = sVar1 + 3) {
    bitset_set(b1,i);
    bitset_set(b2,sVar1);
    i = i + 2;
  }
  sVar1 = bitset_intersection_count(b1,b2);
  _assert_true((ulong)(sVar1 == 0x14e),"bitset_intersection_count(b1, b2) == 334",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0xbb);
  sVar1 = bitset_union_count(b1,b2);
  _assert_true((ulong)(sVar1 == 0x682),"bitset_union_count(b1, b2) == 1666",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/cbitset_unit.c"
               ,0xbc);
  bitset_free(b1);
  bitset_free(b2);
  return;
}

Assistant:

DEFINE_TEST(test_counts) {
    bitset_t *b1 = bitset_create();
    bitset_t *b2 = bitset_create();

    for (int k = 0; k < 1000; ++k) {
        bitset_set(b1, 2 * k);
        bitset_set(b2, 3 * k);
    }
    assert_true(bitset_intersection_count(b1, b2) == 334);
    assert_true(bitset_union_count(b1, b2) == 1666);
    bitset_free(b1);
    bitset_free(b2);
}